

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

bool __thiscall OSSLRSA::signFinal(OSSLRSA *this,ByteString *signature)

{
  Type TVar1;
  OSSLRSAPrivateKey *this_00;
  HashAlgorithm *pHVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar7;
  ByteString *pBVar8;
  size_t sVar9;
  EVP_MD *Hash;
  RSA *pRVar10;
  uchar *puVar11;
  uchar *puVar12;
  ulong uVar13;
  char *format;
  uint sigLen;
  ByteString em;
  ByteString digest;
  ByteString secondHash;
  ByteString firstHash;
  uint local_dc;
  RSA *local_d8;
  ByteString local_d0;
  ByteString local_a8;
  ByteString local_80;
  ByteString local_58;
  int iVar6;
  
  this_00 = (OSSLRSAPrivateKey *)(this->super_AsymmetricAlgorithm).currentPrivateKey;
  TVar1 = (this->super_AsymmetricAlgorithm).currentMechanism;
  bVar3 = AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,signature);
  if (!bVar3) {
    return false;
  }
  ByteString::ByteString(&local_58);
  ByteString::ByteString(&local_80);
  iVar5 = (*this->pCurrentHash->_vptr_HashAlgorithm[4])(this->pCurrentHash,&local_58);
  pHVar2 = this->pSecondHash;
  if (pHVar2 == (HashAlgorithm *)0x0) {
    bVar4 = 1;
  }
  else {
    iVar6 = (*pHVar2->_vptr_HashAlgorithm[4])(pHVar2,&local_80);
    bVar4 = (byte)iVar6;
  }
  if (this->pCurrentHash != (HashAlgorithm *)0x0) {
    (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
  }
  this->pCurrentHash = (HashAlgorithm *)0x0;
  if (this->pSecondHash != (HashAlgorithm *)0x0) {
    (*this->pSecondHash->_vptr_HashAlgorithm[1])();
    this->pSecondHash = (HashAlgorithm *)0x0;
  }
  if (((byte)iVar5 & bVar4) != 1) {
    bVar3 = false;
    goto LAB_0015de25;
  }
  operator+(&local_a8,&local_58,&local_80);
  pBVar8 = (ByteString *)(**(code **)(*(long *)&this_00->super_RSAPrivateKey + 0xb0))(this_00);
  sVar9 = ByteString::size(pBVar8);
  ByteString::resize(signature,sVar9);
  iVar6 = 0;
  iVar5 = 0;
  switch(TVar1) {
  case RSA_MD5_PKCS:
    iVar5 = 4;
    break;
  case RSA_SHA1_PKCS:
    iVar5 = 0x40;
    break;
  case RSA_SHA224_PKCS:
    iVar5 = 0x2a3;
    break;
  case RSA_SHA256_PKCS:
    iVar5 = 0x2a0;
    break;
  case RSA_SHA384_PKCS:
    iVar5 = 0x2a1;
    break;
  case RSA_SHA512_PKCS:
    iVar5 = 0x2a2;
    break;
  case RSA_SHA1_PKCS_PSS:
    Hash = EVP_sha1();
    goto LAB_0015dbdd;
  case RSA_SHA224_PKCS_PSS:
    Hash = EVP_sha224();
    goto LAB_0015dbdd;
  case RSA_SHA256_PKCS_PSS:
    Hash = EVP_sha256();
    goto LAB_0015dbdd;
  case RSA_SHA384_PKCS_PSS:
    Hash = EVP_sha384();
    goto LAB_0015dbdd;
  case RSA_SHA512_PKCS_PSS:
    Hash = EVP_sha512();
LAB_0015dbdd:
    bVar3 = true;
    goto LAB_0015dbe3;
  case RSA_SSL:
    iVar5 = 0x72;
  }
  iVar6 = iVar5;
  bVar3 = false;
  Hash = (EVP_MD *)0x0;
LAB_0015dbe3:
  sVar9 = ByteString::size(signature);
  local_dc = (uint)sVar9;
  local_d8 = (RSA *)OSSLRSAPrivateKey::getOSSLKey(this_00);
  iVar5 = RSA_blinding_on(local_d8,(BN_CTX *)0x0);
  if (iVar5 == 0) {
    bVar3 = false;
    softHSMLog(3,"signFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
               ,0x269,"Failed to turn blinding on for OpenSSL RSA key");
  }
  else {
    if (bVar3) {
      ByteString::ByteString(&local_d0);
      pBVar8 = (ByteString *)(**(code **)(*(long *)&this_00->super_RSAPrivateKey + 0xb0))(this_00);
      sVar9 = ByteString::size(pBVar8);
      ByteString::resize(&local_d0,sVar9);
      pRVar10 = (RSA *)OSSLRSAPrivateKey::getOSSLKey(this_00);
      puVar11 = ByteString::operator[](&local_d0,0);
      puVar12 = ByteString::operator[](&local_a8,0);
      iVar5 = RSA_padding_add_PKCS1_PSS(pRVar10,puVar11,puVar12,Hash,(int)this->sLen);
      if (iVar5 == 1) {
        sVar9 = ByteString::size(&local_d0);
        puVar11 = ByteString::operator[](&local_d0,0);
        puVar12 = ByteString::operator[](signature,0);
        pRVar10 = (RSA *)OSSLRSAPrivateKey::getOSSLKey(this_00);
        uVar7 = RSA_private_encrypt((int)sVar9,puVar11,puVar12,pRVar10,3);
        if ((int)uVar7 < 0) {
          uVar13 = ERR_get_error();
          format = "RSA private encrypt failed (0x%08X)";
          iVar5 = 0x288;
          goto LAB_0015ddbe;
        }
        bVar3 = true;
        local_dc = uVar7;
      }
      else {
        uVar13 = ERR_get_error();
        format = "RSA PSS padding failed (0x%08X)";
        iVar5 = 0x27a;
LAB_0015ddbe:
        bVar3 = false;
        softHSMLog(3,"signFinal",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,iVar5,format,uVar13);
      }
      local_d0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_d0.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
    else {
      puVar11 = ByteString::operator[](&local_a8,0);
      sVar9 = ByteString::size(&local_a8);
      puVar12 = ByteString::operator[](signature,0);
      pRVar10 = (RSA *)OSSLRSAPrivateKey::getOSSLKey(this_00);
      iVar5 = RSA_sign(iVar6,puVar11,(uint)sVar9,puVar12,&local_dc,pRVar10);
      bVar3 = true;
      if (iVar5 < 1) {
        uVar13 = ERR_get_error();
        bVar3 = false;
        softHSMLog(3,"signFinal",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLRSA.cpp"
                   ,0x297,"RSA sign failed (0x%08X)",uVar13);
      }
    }
    RSA_blinding_off(local_d8);
    ByteString::resize(signature,(ulong)local_dc);
  }
  local_a8._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_a8.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
LAB_0015de25:
  local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_80.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_58.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar3;
}

Assistant:

bool OSSLRSA::signFinal(ByteString& signature)
{
	// Save necessary state before calling super class signFinal
	OSSLRSAPrivateKey* pk = (OSSLRSAPrivateKey*) currentPrivateKey;
	AsymMech::Type mechanism = currentMechanism;

	if (!AsymmetricAlgorithm::signFinal(signature))
	{
		return false;
	}

	ByteString firstHash, secondHash;

	bool bFirstResult = pCurrentHash->hashFinal(firstHash);
	bool bSecondResult = (pSecondHash != NULL) ? pSecondHash->hashFinal(secondHash) : true;

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (pSecondHash != NULL)
	{
		delete pSecondHash;

		pSecondHash = NULL;
	}

	if (!bFirstResult || !bSecondResult)
	{
		return false;
	}

	ByteString digest = firstHash + secondHash;

	// Resize the data block for the signature to the modulus size of the key
	signature.resize(pk->getN().size());

	// Determine the signature NID type
	int type = 0;
	bool isPSS = false;
	const EVP_MD* hash = NULL;

	switch (mechanism)
	{
		case AsymMech::RSA_MD5_PKCS:
			type = NID_md5;
			break;
		case AsymMech::RSA_SHA1_PKCS:
			type = NID_sha1;
			break;
		case AsymMech::RSA_SHA224_PKCS:
			type = NID_sha224;
			break;
		case AsymMech::RSA_SHA256_PKCS:
			type = NID_sha256;
			break;
		case AsymMech::RSA_SHA384_PKCS:
			type = NID_sha384;
			break;
		case AsymMech::RSA_SHA512_PKCS:
			type = NID_sha512;
			break;
		case AsymMech::RSA_SHA1_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha1();
			break;
		case AsymMech::RSA_SHA224_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha224();
			break;
		case AsymMech::RSA_SHA256_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha256();
			break;
		case AsymMech::RSA_SHA384_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha384();
			break;
		case AsymMech::RSA_SHA512_PKCS_PSS:
			isPSS = true;
			hash = EVP_sha512();
			break;
		case AsymMech::RSA_SSL:
			type = NID_md5_sha1;
			break;
		default:
			break;
	}

	// Perform the signature operation
	unsigned int sigLen = signature.size();

	RSA* rsa = pk->getOSSLKey();

	if (!RSA_blinding_on(rsa, NULL))
	{
		ERROR_MSG("Failed to turn blinding on for OpenSSL RSA key");

		return false;
	}

	bool rv;
	int result;

	if (isPSS)
	{
		ByteString em;
		em.resize(pk->getN().size());

		result = (RSA_padding_add_PKCS1_PSS(pk->getOSSLKey(), &em[0], &digest[0],
						hash, sLen) == 1);
		if (!result)
		{
			ERROR_MSG("RSA PSS padding failed (0x%08X)", ERR_get_error());
			rv = false;
		}
		else
		{
			result = RSA_private_encrypt(em.size(), &em[0], &signature[0],
							 pk->getOSSLKey(), RSA_NO_PADDING);
			if (result >= 0)
			{
				sigLen = result;
				rv = true;
			}
			else
			{
				ERROR_MSG("RSA private encrypt failed (0x%08X)", ERR_get_error());
				rv = false;
			}
		}
	}
	else
	{
		result = RSA_sign(type, &digest[0], digest.size(), &signature[0],
			       &sigLen, pk->getOSSLKey());
		if (result > 0)
		{
			rv = true;
		}
		else
		{
			ERROR_MSG("RSA sign failed (0x%08X)", ERR_get_error());
			rv = false;
		}
	}

	RSA_blinding_off(rsa);

	signature.resize(sigLen);

	return rv;
}